

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

bool __thiscall QPDF::parse_xrefFirst(QPDF *this,string *line,int *obj,int *num,int *bytes)

{
  pointer pcVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  byte *pbVar6;
  long i;
  string obj_str;
  string num_str;
  char *local_78;
  ulong local_70;
  char local_68;
  undefined7 uStack_67;
  int *local_58;
  char *local_50;
  ulong local_48;
  char local_40;
  undefined7 uStack_3f;
  
  pcVar1 = (line->_M_dataplus)._M_p;
  for (i = 0; (bVar3 = pcVar1[i], bVar3 - 9 < 5 || (bVar3 == 0x20)); i = i + 1) {
  }
  if (9 < (byte)(bVar3 - 0x30)) {
    return false;
  }
  local_78 = &local_68;
  local_70 = 0;
  local_68 = '\0';
  local_58 = num;
  for (; bVar3 = pcVar1[i], (byte)(bVar3 - 0x30) < 10; i = i + 1) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
  }
  if ((bVar3 - 9 < 5) || (bVar3 == 0x20)) {
    while ((bVar3 - 9 < 5 || (bVar3 == 0x20))) {
      lVar2 = i + 1;
      i = i + 1;
      bVar3 = pcVar1[lVar2];
    }
    if ((byte)(bVar3 - 0x30) < 10) {
      local_48 = 0;
      local_40 = '\0';
      local_50 = &local_40;
      for (pbVar6 = (byte *)(pcVar1 + i + 1); bVar3 = pbVar6[-1], (byte)(bVar3 - 0x30) < 10;
          pbVar6 = pbVar6 + 1) {
        i = i + 1;
        std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
      }
      while ((bVar3 - 9 < 5 || (bVar3 == 0x20))) {
        i = i + 1;
        bVar3 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      }
      if ((int)i != i) {
        QIntC::IntConverter<long,_int,_true,_true>::error(i);
      }
      *bytes = (int)i;
      iVar4 = QUtil::string_to_int(local_78);
      *obj = iVar4;
      iVar4 = QUtil::string_to_int(local_50);
      *local_58 = iVar4;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      bVar5 = true;
      goto LAB_0022a213;
    }
  }
  bVar5 = false;
LAB_0022a213:
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return bVar5;
}

Assistant:

bool
QPDF::parse_xrefFirst(std::string const& line, int& obj, int& num, int& bytes)
{
    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.
    char const* p = line.c_str();
    char const* start = line.c_str();

    // Skip zero or more spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string obj_str;
    while (util::is_digit(*p)) {
        obj_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string num_str;
    while (util::is_digit(*p)) {
        num_str.append(1, *p++);
    }
    // Skip any space including line terminators
    while (util::is_space(*p)) {
        ++p;
    }
    bytes = toI(p - start);
    obj = QUtil::string_to_int(obj_str.c_str());
    num = QUtil::string_to_int(num_str.c_str());
    return true;
}